

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool __thiscall testing::internal::linked_ptr_internal::depart(linked_ptr_internal *this)

{
  linked_ptr_internal *plVar1;
  linked_ptr_internal *plVar2;
  linked_ptr_internal *plVar3;
  MutexLock lock;
  GTestMutexLock local_10;
  
  local_10.mutex_ = (MutexBase *)g_linked_ptr_mutex;
  MutexBase::Lock((MutexBase *)g_linked_ptr_mutex);
  plVar1 = this->next_;
  plVar2 = plVar1;
  if (plVar1 != this) {
    do {
      plVar3 = plVar2;
      plVar2 = plVar3->next_;
    } while (plVar2 != this);
    plVar3->next_ = plVar1;
  }
  GTestMutexLock::~GTestMutexLock(&local_10);
  return plVar1 == this;
}

Assistant:

bool depart()
      GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    if (next_ == this) return true;
    linked_ptr_internal const* p = next_;
    while (p->next_ != this) p = p->next_;
    p->next_ = next_;
    return false;
  }